

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawInventoryBar::Tick
          (CommandDrawInventoryBar *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  undefined1 auVar1 [16];
  int iVar2;
  SBarInfoCoordinate SVar3;
  ulong uVar4;
  CommandDrawNumber **ppCVar5;
  CommandDrawNumber *this_00;
  int local_74;
  int local_64;
  uint local_48;
  uint i_1;
  uint local_2c;
  uint i;
  int spacing;
  bool hudChanged_local;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandDrawInventoryBar *this_local;
  
  if (this->counters == (CommandDrawNumber **)0x0) {
    iVar2 = GetCounterSpacing(this,statusBar);
    auVar1 = ZEXT416(this->size) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppCVar5 = (CommandDrawNumber **)operator_new__(uVar4);
    this->counters = ppCVar5;
    for (local_2c = 0; local_2c < this->size; local_2c = local_2c + 1) {
      this_00 = (CommandDrawNumber *)operator_new(0xa0);
      CommandDrawNumber::CommandDrawNumber(this_00,(this->super_SBarInfoCommand).script);
      this->counters[local_2c] = this_00;
      if ((this->vertical & 1U) == 0) {
        local_64 = iVar2 * local_2c;
      }
      else {
        local_64 = 0;
      }
      SVar3 = SBarInfoCoordinate::operator+(&this->counterX,local_64);
      (this->counters[local_2c]->super_CommandDrawString).startX = SVar3;
      if ((this->vertical & 1U) == 0) {
        local_74 = 0;
      }
      else {
        local_74 = iVar2 * local_2c;
      }
      SVar3 = SBarInfoCoordinate::operator+(&this->counterY,local_74);
      (this->counters[local_2c]->super_CommandDrawString).y = SVar3;
      this->counters[local_2c]->normalTranslation = this->translation;
      (this->counters[local_2c]->super_CommandDrawString).font = this->font;
      (this->counters[local_2c]->super_CommandDrawString).spacing = this->fontSpacing;
      (this->counters[local_2c]->super_CommandDrawString).field_0x5d =
           (this->alwaysShowCounter ^ 0xffU) & 1;
      this->counters[local_2c]->value = CONSTANT;
      this->counters[local_2c]->drawValue = 0x1c;
      this->counters[local_2c]->length = 0x7fffffff;
      (this->counters[local_2c]->super_CommandDrawString).shadow = (bool)(this->shadow & 1);
      (this->counters[local_2c]->super_CommandDrawString).shadowX = this->shadowX;
      (this->counters[local_2c]->super_CommandDrawString).shadowY = this->shadowY;
    }
  }
  for (local_48 = 0; local_48 < this->size; local_48 = local_48 + 1) {
    (*(this->counters[local_48]->super_CommandDrawString).super_SBarInfoCommand.
      _vptr_SBarInfoCommand[5])(this->counters[local_48],block,statusBar,(ulong)hudChanged);
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			// Make the counters if need be.
			if(counters == NULL)
			{
				int spacing = GetCounterSpacing(statusBar);

				counters = new CommandDrawNumber*[size];
		
				for(unsigned int i = 0;i < size;i++)
				{
					counters[i] = new CommandDrawNumber(script);
		
					counters[i]->startX = counterX + (!vertical ? spacing*i : 0);
					counters[i]->y = counterY + (vertical ? spacing*i : 0);
					counters[i]->normalTranslation = translation;
					counters[i]->font = font;
					counters[i]->spacing = fontSpacing;
					counters[i]->whenNotZero = !alwaysShowCounter;
					counters[i]->drawValue = counters[i]->value = CommandDrawNumber::CONSTANT;
					counters[i]->length = INT_MAX;
					counters[i]->shadow = shadow;
					counters[i]->shadowX = shadowX;
					counters[i]->shadowY = shadowY;
				}
			}
		
			for(unsigned int i = 0;i < size;i++)
				counters[i]->Tick(block, statusBar, hudChanged);
		}